

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_88 [2];
  long local_78 [2];
  _Alloc_hider local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  string dot_extension;
  
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,".","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_88);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    dot_extension._M_string_length = *psVar5;
    dot_extension.field_2._M_allocated_capacity = plVar4[3];
    local_48 = (undefined1  [8])&dot_extension._M_string_length;
  }
  else {
    dot_extension._M_string_length = *psVar5;
    local_48 = (undefined1  [8])*plVar4;
  }
  dot_extension._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  bVar3 = String::EndsWithCaseInsensitive(&this->pathname_,(string *)local_48);
  if (bVar3) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)this);
    paVar1 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_68._M_p == &local_58) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
      *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_50;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = local_68._M_p;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity =
           CONCAT71(uStack_57,local_58);
    }
    (__return_storage_ptr__->pathname_)._M_string_length = local_60;
    local_60 = 0;
    local_58 = '\0';
    local_68._M_p = &local_58;
    Normalize(__return_storage_ptr__);
    if (local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,CONCAT71(uStack_57,local_58) + 1);
    }
  }
  else {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar2 = (this->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->pathname_)._M_string_length);
  }
  if (local_48 != (undefined1  [8])&dot_extension._M_string_length) {
    operator_delete((void *)local_48,dot_extension._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(
        pathname_.substr(0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}